

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tl.cpp
# Opt level: O0

bool __thiscall
pg::TLSolver::attractTangle(TLSolver *this,int t,int pl,bitset *R,bitset *Z,int maxpr)

{
  int iVar1;
  bool bVar2;
  value_type vVar3;
  uint *puVar4;
  reference pvVar5;
  reference ppiVar6;
  reference pvVar7;
  ostream *poVar8;
  int *piVar9;
  uint *puVar10;
  _label_vertex _Var11;
  _label_vertex local_d0;
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  undefined1 local_a0 [24];
  int s;
  int v_2;
  int *ptr_2;
  int local_6c;
  int *piStack_68;
  int v_1;
  int *ptr_1;
  int *local_50;
  int *ptr;
  int v;
  int e;
  int tangle_pr;
  int maxpr_local;
  bitset *Z_local;
  bitset *R_local;
  int pl_local;
  int t_local;
  TLSolver *this_local;
  uintqueue *local_10;
  
  e = maxpr;
  _tangle_pr = Z;
  Z_local = R;
  R_local._0_4_ = pl;
  R_local._4_4_ = t;
  _pl_local = this;
  puVar4 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](&this->tpr,(long)t);
  v = *puVar4;
  if (((v != 0xffffffff) && (v <= e)) && ((uint)R_local == (v & 1U))) {
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->tescs,(long)R_local._4_4_);
    ptr._4_4_ = *pvVar5;
    if (ptr._4_4_ == 0) {
      ppiVar6 = std::vector<int_*,_std::allocator<int_*>_>::operator[]
                          (&this->tout,(long)R_local._4_4_);
      local_50 = *ppiVar6;
      while( true ) {
        ptr._0_4_ = *local_50;
        if ((int)ptr == -1) break;
        local_50 = local_50 + 1;
        bitset::operator[]((bitset *)&ptr_1,(size_t)&this->G);
        bVar2 = bitset::reference::operator_cast_to_bool((reference *)&ptr_1);
        if (bVar2) {
          ptr._4_4_ = ptr._4_4_ + 1;
        }
      }
      ptr._0_4_ = 0xffffffff;
      local_50 = local_50 + 1;
    }
    vVar3 = ptr._4_4_ - 1;
    ptr._4_4_ = vVar3;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->tescs,(long)R_local._4_4_);
    *pvVar5 = vVar3;
    if ((int)ptr._4_4_ < 1) {
      ppiVar6 = std::vector<int_*,_std::allocator<int_*>_>::operator[]
                          (&this->tv,(long)R_local._4_4_);
      piStack_68 = *ppiVar6;
      do {
        piVar9 = piStack_68 + 1;
        local_6c = *piStack_68;
        if (local_6c == -1) {
          piStack_68 = piVar9;
          if (e == 0x7fffffff) {
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&this->tpr,(long)R_local._4_4_);
            *pvVar7 = -1;
          }
          ppiVar6 = std::vector<int_*,_std::allocator<int_*>_>::operator[]
                              (&this->tv,(long)R_local._4_4_);
          _s = (uint *)*ppiVar6;
          while( true ) {
            puVar10 = _s + 1;
            local_a0._20_4_ = *_s;
            if (local_a0._20_4_ == 0xffffffff) break;
            _s = _s + 2;
            local_a0._16_4_ = *puVar10;
            bitset::operator[]((bitset *)local_a0,(size_t)_tangle_pr);
            bVar2 = bitset::reference::operator_cast_to_bool((reference *)local_a0);
            if (!bVar2) {
              bitset::operator[]((bitset *)local_b0,(size_t)Z_local);
              bVar2 = bitset::reference::operator_cast_to_bool((reference *)local_b0);
              if (((bVar2 ^ 0xffU) & 1) == 0) {
                bitset::operator[]((bitset *)local_c0,(size_t)_tangle_pr);
                bitset::reference::operator=((reference *)local_c0,true);
                this->str[(int)local_a0._20_4_] = local_a0._16_4_;
                local_10 = &this->Q;
                this_local._4_4_ = local_a0._20_4_;
                iVar1 = (this->Q).pointer;
                (this->Q).pointer = iVar1 + 1;
                local_10->queue[iVar1] = local_a0._20_4_;
                if (2 < (this->super_Solver).trace) {
                  poVar8 = std::operator<<((this->super_Solver).logger,
                                           "\x1b[1;37mattracted \x1b[36m");
                  _Var11 = Solver::label_vertex(&this->super_Solver,local_a0._20_4_);
                  local_d0.g = _Var11.g;
                  local_d0.v = _Var11.v;
                  poVar8 = operator<<(poVar8,&local_d0);
                  poVar8 = std::operator<<(poVar8,"\x1b[m by \x1b[1;36m");
                  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(uint)R_local);
                  std::operator<<(poVar8,"\x1b[m");
                  poVar8 = std::operator<<((this->super_Solver).logger," (via tangle ");
                  poVar8 = (ostream *)std::ostream::operator<<(poVar8,R_local._4_4_);
                  poVar8 = std::operator<<(poVar8,")");
                  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
                }
              }
            }
          }
          return true;
        }
        piStack_68 = piStack_68 + 2;
        bitset::operator[]((bitset *)&ptr_2,(size_t)&this->G);
        bVar2 = bitset::reference::operator_cast_to_bool((reference *)&ptr_2);
      } while (((bVar2 ^ 0xffU) & 1) == 0);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&this->tpr,(long)R_local._4_4_);
      *pvVar7 = -1;
    }
  }
  return false;
}

Assistant:

bool
TLSolver::attractTangle(const int t, const int pl, bitset &R, bitset &Z, int maxpr)
{
    /**
     * Check if tangle is won by player <pl> and not deleted.
     */
    {
        const int tangle_pr = tpr[t];
        if (tangle_pr == -1) return false; // deleted tangle
        if (tangle_pr > maxpr) return false; // too high...
        if (pl != (tangle_pr&1)) return false; // not of desired parity
    }

    /**
     * Check if the tangle can escape to R\Z.
     */
    {
        int e = tescs[t];
        if (e == 0) {
            int v, *ptr = tout[t];
            while ((v=*ptr++) != -1) {
                if (G[v]) e++;
            }
        }
        tescs[t] = --e;
        if (e > 0) return false;
    }

    /**
     * On-the-fly detect out-of-game tangles
     */
    {
        int *ptr = tv[t];
        for (;;) {
            const int v = *ptr++;
            if (v == -1) break;
            ptr++; // skip strategy
            if (!G[v]) {
                // on-the-fly detect out-of-game tangles
                tpr[t] = -1; // delete the tangle
                return false; // is now a deleted tangle
            }
        }
    }

    if (maxpr == INT_MAX) {
        // attracted to a dominion, so delete the tangle
        tpr[t] = -1;
    }

    /**
     * Attract!
     */
    {
        int *ptr = tv[t];
        for (;;) {
            const int v = *ptr++;
            if (v == -1) break;
            const int s = *ptr++;
            if (Z[v]) continue; // already in <Z>
            if (!R[v]) continue; // not in <R> (might be higher region)
            Z[v] = true;
            str[v] = s;
            Q.push(v);

#ifndef NDEBUG
            // maybe report event
            if (trace >= 3) {
                logger << "\033[1;37mattracted \033[36m" << label_vertex(v) << "\033[m by \033[1;36m" << pl << "\033[m";
                logger << " (via tangle " << t << ")" << std::endl;
            }
#endif
        }
    }

    return true;
}